

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O0

int __thiscall
icu_63::TZEnumeration::clone
          (TZEnumeration *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  TZEnumeration *this_00;
  undefined8 local_30;
  TZEnumeration *this_local;
  
  this_00 = (TZEnumeration *)UMemory::operator_new((UMemory *)0x90,(size_t)__fn);
  local_30 = (TZEnumeration *)0x0;
  if (this_00 != (TZEnumeration *)0x0) {
    TZEnumeration(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

virtual StringEnumeration *clone() const {
        return new TZEnumeration(*this);
    }